

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorProto_ExtensionRange::Clear(DescriptorProto_ExtensionRange *this)

{
  ExtensionRangeOptions *this_00;
  anon_union_24_1_493b367e_for_DescriptorProto_ExtensionRange_4 aVar1;
  LogMessageFatal local_20 [16];
  
  aVar1 = this->field_0;
  if (((undefined1  [24])aVar1 & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
    this_00 = (this->field_0)._impl_.options_;
    if (this_00 == (ExtensionRangeOptions *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.pb.cc"
                 ,0xe87,0x1a,"_impl_.options_ != nullptr");
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
    }
    ExtensionRangeOptions::Clear(this_00);
  }
  if (((undefined1  [24])aVar1 & (undefined1  [24])0x6) != (undefined1  [24])0x0) {
    *(undefined8 *)((long)&this->field_0 + 0x10) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void DescriptorProto_ExtensionRange::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.DescriptorProto.ExtensionRange)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    ABSL_DCHECK(_impl_.options_ != nullptr);
    _impl_.options_->Clear();
  }
  if (cached_has_bits & 0x00000006u) {
    ::memset(&_impl_.start_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.end_) -
        reinterpret_cast<char*>(&_impl_.start_)) + sizeof(_impl_.end_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}